

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x882320;
  *(undefined8 *)&this->field_0x90 = 0x882370;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x882348;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48;
  if (puVar3 != &this->field_0x58) {
    operator_delete(puVar3,*(long *)&this->field_0x58 + 1);
  }
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x882398;
  *(undefined8 *)&this->field_0x90 = 0x8823c0;
  puVar4 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
  puVar3 = &(this->super_IfcNamedUnit).field_0x28;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}